

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O0

Aig_Cut_t * Aig_ObjPrepareCuts(Aig_ManCut_t *p,Aig_Obj_t *pObj,int fTriv)

{
  uint uVar1;
  Aig_Cut_t *pCuts;
  uint *__s;
  int local_34;
  Aig_Cut_t *pAStack_30;
  int i;
  Aig_Cut_t *pCut;
  Aig_Cut_t *pCutSet;
  int fTriv_local;
  Aig_Obj_t *pObj_local;
  Aig_ManCut_t *p_local;
  
  pCuts = (Aig_Cut_t *)Aig_MmFixedEntryFetch(p->pMemCuts);
  Aig_ObjSetCuts(p,pObj,pCuts);
  local_34 = 0;
  pAStack_30 = Aig_ObjCuts(p,pObj);
  while (local_34 < p->nCutsMax) {
    pAStack_30->nFanins = '\0';
    pAStack_30->iNode = pObj->Id;
    pAStack_30->nCutSize = (short)p->nCutSize;
    pAStack_30->nLeafMax = (char)p->nLeafMax;
    local_34 = local_34 + 1;
    pAStack_30 = Aig_CutNext(pAStack_30);
  }
  if (fTriv != 0) {
    pCuts->Cost = 0;
    pCuts->iNode = pObj->Id;
    pCuts->nFanins = '\x01';
    *(int *)&pCuts[1].pNext = pObj->Id;
    uVar1 = Aig_ObjCutSign(pObj->Id);
    pCuts->uSign = uVar1;
    if (p->fTruth != 0) {
      __s = Aig_CutTruth(pCuts);
      memset(__s,0xaa,(long)p->nTruthWords << 2);
    }
  }
  return pCuts;
}

Assistant:

Aig_Cut_t * Aig_ObjPrepareCuts( Aig_ManCut_t * p, Aig_Obj_t * pObj, int fTriv )
{
    Aig_Cut_t * pCutSet, * pCut;
    int i;
    // create the cutset of the node
    pCutSet = (Aig_Cut_t *)Aig_MmFixedEntryFetch( p->pMemCuts );
    Aig_ObjSetCuts( p, pObj, pCutSet );
    Aig_ObjForEachCut( p, pObj, pCut, i )
    {
        pCut->nFanins  = 0;
        pCut->iNode    = pObj->Id;
        pCut->nCutSize = p->nCutSize;
        pCut->nLeafMax = p->nLeafMax;
    }
    // add unit cut if needed
    if ( fTriv )
    {
        pCut = pCutSet;
        pCut->Cost = 0;
        pCut->iNode = pObj->Id;
        pCut->nFanins = 1;
        pCut->pFanins[0] = pObj->Id;
        pCut->uSign = Aig_ObjCutSign( pObj->Id );
        if ( p->fTruth )
        memset( Aig_CutTruth(pCut), 0xAA, sizeof(unsigned) * p->nTruthWords );
    }
    return pCutSet;
}